

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:63:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:65:10)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:63:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:65:10)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> *response;
  TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:63:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:65:10)>
  *this_00;
  Type local_3b8 [2];
  DebugComparison<kj::Exception::Type,_kj::Exception::Type> _kjCondition;
  ExceptionOr<kj::_::Void> local_390;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> depResult;
  
  response = &depResult;
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  this_00 = this;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&response->super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    _kjCondition.left = UNIMPLEMENTED;
    _kjCondition.right = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type == UNIMPLEMENTED;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      local_3b8[1] = 3;
      local_3b8[0] = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type;
      Debug::
      log<char_const(&)[71],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&,kj::Exception::Type,kj::Exception::Type>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(kj::Exception::Type::UNIMPLEMENTED) == (e.getType())\", _kjCondition, kj::Exception::Type::UNIMPLEMENTED, e.getType()"
                 ,(char (*) [71])
                  "failed: expected (kj::Exception::Type::UNIMPLEMENTED) == (e.getType())",
                 &_kjCondition,local_3b8 + 1,local_3b8);
    }
    *(this->errorHandler).barFailed = true;
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_0016b7f6;
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)this_00,
               (Response<capnproto_test::capnp::test::TestInterface::BarResults> *)response);
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_390);
LAB_0016b7f6:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::
  ~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }